

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O1

int mwIsOwned(mwData *mw,char *file,int line)

{
  char cVar1;
  int iVar2;
  mwData **ppmVar3;
  mwStat *pmVar4;
  char *pcVar5;
  mwData *pmVar6;
  uint uVar7;
  
  uVar7 = 0x38;
  if (mwDataSize == '\0') {
    uVar7 = 0;
  }
  iVar2 = mwIsSafeAddr(mw,uVar7);
  if (iVar2 == 0) {
    return 0;
  }
  if (((mwHead == (mwData *)0x0) && (mwTail == (mwData *)0x0)) && (mwStatCurAlloc == 0)) {
    return 0;
  }
  if ((mw->count ^ mw->check ^ mw->size ^ (long)mw->line) == 0xfe0180) {
    if (mw->prev != (mwData *)0x0) {
      uVar7 = 0x38;
      if (mwDataSize == '\0') {
        uVar7 = 0;
      }
      iVar2 = mwIsSafeAddr(mw->prev,uVar7);
      if (iVar2 == 0) {
        mwRelink(mw,file,line);
      }
    }
    if (mw->next != (mwData *)0x0) {
      uVar7 = 0x38;
      if (mwDataSize == '\0') {
        uVar7 = 0;
      }
      iVar2 = mwIsSafeAddr(mw->next,uVar7);
      if (iVar2 == 0) {
        mwRelink(mw,file,line);
      }
    }
    ppmVar3 = &mwHead;
    if (mw->prev != (mwData *)0x0) {
      ppmVar3 = &mw->prev->next;
    }
    pmVar6 = (mwData *)&mwTail;
    if (mw->next != (mwData *)0x0) {
      pmVar6 = mw->next;
    }
    cVar1 = (*ppmVar3 == mw) + '\x01';
    if (pmVar6->prev != mw) {
      cVar1 = *ppmVar3 == mw;
    }
    if (2 < (byte)(((mw->count ^ mw->check ^ mw->size ^ (long)mw->line) == 0xfe0180) + cVar1)) {
      return 1;
    }
    iVar2 = mwIsHeapOK(mw);
    if ((iVar2 == 0) && (iVar2 = mwRelink(mw,file,line), iVar2 != 0)) {
      return 1;
    }
    mwWrite("internal: <%ld> %s(%d), mwIsOwned fails for MW-%p\n",mwCounter,file,(ulong)(uint)line,
            mw);
    mwErrors = mwErrors + 1;
    iVar2 = mwFlushR();
    mwFlushingB2 = iVar2 + 1;
    mwFlushingB1 = mwFlushingB2;
    mwFlushing = mwFlushingB2;
    mwFlush();
    return 0;
  }
  iVar2 = mwIsHeapOK(mw);
  if (iVar2 == 0) {
    return 0;
  }
  mwWrite("internal: <%ld> %s(%d), checksum for MW-%p is incorrect\n",mwCounter,file,
          (ulong)(uint)line,mw);
  mwErrors = mwErrors + 1;
  iVar2 = mwFlushR();
  mwFlushingB2 = iVar2 + 1;
  mwFlushingB1 = mwFlushingB2;
  mwFlushing = mwFlushingB2;
  mwFlush();
  iVar2 = mwIsReadAddr(mw->file,1);
  if (iVar2 == 0) {
    pcVar5 = "<unknown>";
  }
  else {
    pmVar4 = mwStatGet(mw->file,-1,0);
    if (pmVar4 != (mwStat *)0x0) goto LAB_001068ab;
    pcVar5 = "<relinked>";
  }
  mw->file = pcVar5;
LAB_001068ab:
  mw->size = 0;
  mw->check = (long)mw->line ^ mw->count ^ 0xfe0180;
  return 1;
}

Assistant:

static int mwIsOwned(mwData *mw, const char *file, int line)
{
	int retv;
	mwStat *ms;

	/* see if the address is legal according to OS */
	if (!mwIsSafeAddr(mw, mwDataSize)) {
		return 0;
	}

	/* make sure we have _anything_ allocated */
	if (mwHead == NULL && mwTail == NULL && mwStatCurAlloc == 0) {
		return 0;
	}

	/* calculate checksum */
	if (mw->check != CHKVAL(mw)) {
		/* may be damaged checksum, see if block is in heap */
		if (mwIsHeapOK(mw)) {
			/* damaged checksum, repair it */
			mwWrite("internal: <%ld> %s(%d), checksum for MW-%p is incorrect\n",
					mwCounter, file, line, mw);
			mwIncErr();
			if (mwIsReadAddr(mw->file, 1)) {
				ms = mwStatGet(mw->file, -1, 0);
				if (ms == NULL) {
					mw->file = "<relinked>";
				}
			} else {
				mw->file = "<unknown>";
			}
			mw->size = 0;
			mw->check = CHKVAL(mw);
			return 1;
		}
		/* no, it's just some garbage data */
		return 0;
	}

	/* check that the non-NULL pointers are safe */
	if (mw->prev && !mwIsSafeAddr(mw->prev, mwDataSize)) {
		mwRelink(mw, file, line);
	}
	if (mw->next && !mwIsSafeAddr(mw->next, mwDataSize)) {
		mwRelink(mw, file, line);
	}

	/* safe address, checksum OK, proceed with heap checks */

	/* see if the block is in the heap */
	retv = 0;
	if (mw->prev) {
		if (mw->prev->next == mw) {
			retv ++;
		}
	} else {
		if (mwHead == mw) {
			retv++;
		}
	}
	if (mw->next) {
		if (mw->next->prev == mw) {
			retv ++;
		}
	} else {
		if (mwTail == mw) {
			retv++;
		}
	}
	if (mw->check == CHKVAL(mw)) {
		retv ++;
	}
	if (retv > 2) {
		return 1;
	}

	/* block not in heap, check heap for corruption */

	if (!mwIsHeapOK(mw)) {
		if (mwRelink(mw, file, line)) {
			return 1;
		}
	}

	/* unable to repair */
	mwWrite("internal: <%ld> %s(%d), mwIsOwned fails for MW-%p\n",
			mwCounter, file, line, mw);
	mwIncErr();

	return 0;
}